

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O1

void __thiscall btQuantizedBvh::swapLeafNodes(btQuantizedBvh *this,int i,int splitIndex)

{
  btQuantizedBvhNode *pbVar1;
  unsigned_short *puVar2;
  btQuantizedBvhNode *pbVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  btOptimizedBvhNode *pbVar19;
  unsigned_short uVar20;
  unsigned_short uVar21;
  unsigned_short uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  btOptimizedBvhNode *pbVar29;
  btQuantizedBvhNode tmp;
  
  lVar27 = (long)splitIndex;
  if (this->m_useQuantization == true) {
    pbVar3 = (this->m_quantizedLeafNodes).m_data;
    pbVar1 = pbVar3 + i;
    uVar8._0_2_ = pbVar1->m_quantizedAabbMin[0];
    uVar8._2_2_ = pbVar1->m_quantizedAabbMin[1];
    uVar4 = pbVar1->m_quantizedAabbMin[2];
    uVar5 = pbVar1->m_quantizedAabbMax[0];
    uVar8._4_4_ = CONCAT22(uVar5,uVar4);
    uVar6 = *(undefined8 *)(pbVar1->m_quantizedAabbMax + 1);
    lVar28 = lVar27 * 0x10;
    pbVar1 = pbVar3 + lVar27;
    uVar20 = pbVar1->m_quantizedAabbMin[1];
    uVar21 = pbVar1->m_quantizedAabbMin[2];
    uVar22 = pbVar1->m_quantizedAabbMax[0];
    uVar7 = *(undefined8 *)(pbVar1->m_quantizedAabbMax + 1);
    pbVar3 = pbVar3 + i;
    pbVar3->m_quantizedAabbMin[0] = pbVar1->m_quantizedAabbMin[0];
    pbVar3->m_quantizedAabbMin[1] = uVar20;
    pbVar3->m_quantizedAabbMin[2] = uVar21;
    pbVar3->m_quantizedAabbMax[0] = uVar22;
    *(undefined8 *)(pbVar3->m_quantizedAabbMax + 1) = uVar7;
    pbVar29 = (btOptimizedBvhNode *)(this->m_quantizedLeafNodes).m_data;
    tmp.m_quantizedAabbMin._0_4_ = SUB84(uVar8,0);
    tmp.m_quantizedAabbMax._2_4_ = SUB84(uVar6,0);
    tmp.m_escapeIndexOrTriangleIndex = (int)((ulong)uVar6 >> 0x20);
  }
  else {
    pbVar29 = (this->m_leafNodes).m_data;
    uVar8 = *(undefined8 *)pbVar29[i].m_aabbMinOrg.m_floats;
    uVar6 = *(undefined8 *)(pbVar29[i].m_aabbMinOrg.m_floats + 2);
    uVar7 = *(undefined8 *)pbVar29[i].m_aabbMaxOrg.m_floats;
    uVar9 = *(undefined8 *)(pbVar29[i].m_aabbMaxOrg.m_floats + 2);
    pbVar19 = pbVar29 + i;
    iVar25 = pbVar19->m_escapeIndex;
    iVar26 = pbVar19->m_subPart;
    uVar10 = *(undefined8 *)(&pbVar19->m_escapeIndex + 2);
    uVar11 = *(undefined8 *)(pbVar29[i].m_padding + 4);
    uVar12 = *(undefined8 *)(pbVar29[i].m_padding + 4 + 8);
    lVar28 = lVar27 * 0x40;
    uVar13 = *(undefined8 *)(pbVar29[lVar27].m_aabbMinOrg.m_floats + 2);
    uVar14 = *(undefined8 *)pbVar29[lVar27].m_aabbMaxOrg.m_floats;
    uVar15 = *(undefined8 *)(pbVar29[lVar27].m_aabbMaxOrg.m_floats + 2);
    pbVar19 = pbVar29 + lVar27;
    iVar23 = pbVar19->m_escapeIndex;
    iVar24 = pbVar19->m_subPart;
    uVar16 = *(undefined8 *)(&pbVar19->m_escapeIndex + 2);
    uVar17 = *(undefined8 *)(pbVar29[lVar27].m_padding + 4);
    uVar18 = *(undefined8 *)(pbVar29[lVar27].m_padding + 4 + 8);
    *(undefined8 *)pbVar29[i].m_aabbMinOrg.m_floats =
         *(undefined8 *)pbVar29[lVar27].m_aabbMinOrg.m_floats;
    *(undefined8 *)(pbVar29[i].m_aabbMinOrg.m_floats + 2) = uVar13;
    *(undefined8 *)pbVar29[i].m_aabbMaxOrg.m_floats = uVar14;
    *(undefined8 *)(pbVar29[i].m_aabbMaxOrg.m_floats + 2) = uVar15;
    pbVar19 = pbVar29 + i;
    pbVar19->m_escapeIndex = iVar23;
    pbVar19->m_subPart = iVar24;
    *(undefined8 *)(&pbVar19->m_escapeIndex + 2) = uVar16;
    *(undefined8 *)(pbVar29[i].m_padding + 4) = uVar17;
    *(undefined8 *)(pbVar29[i].m_padding + 4 + 8) = uVar18;
    pbVar29 = (this->m_leafNodes).m_data;
    tmp.m_quantizedAabbMin._0_4_ = SUB84(uVar8,0);
    tmp._4_4_ = SUB84((ulong)uVar8 >> 0x20,0);
    tmp.m_quantizedAabbMax._2_4_ = SUB84(uVar6,0);
    tmp.m_escapeIndexOrTriangleIndex = (int)((ulong)uVar6 >> 0x20);
    *(undefined8 *)pbVar29[lVar27].m_aabbMaxOrg.m_floats = uVar7;
    *(undefined8 *)(pbVar29[lVar27].m_aabbMaxOrg.m_floats + 2) = uVar9;
    pbVar19 = pbVar29 + lVar27;
    pbVar19->m_escapeIndex = iVar25;
    pbVar19->m_subPart = iVar26;
    *(undefined8 *)(&pbVar19->m_escapeIndex + 2) = uVar10;
    *(undefined8 *)(pbVar29[lVar27].m_padding + 4) = uVar11;
    *(undefined8 *)(pbVar29[lVar27].m_padding + 4 + 8) = uVar12;
    uVar8._4_4_ = tmp._4_4_;
  }
  puVar2 = (unsigned_short *)((long)(pbVar29->m_aabbMinOrg).m_floats + lVar28);
  *(undefined4 *)puVar2 = tmp.m_quantizedAabbMin._0_4_;
  puVar2[2] = (unsigned_short)uVar8._4_4_;
  puVar2[3] = SUB42(uVar8._4_4_,2);
  *(undefined4 *)(puVar2 + 4) = tmp.m_quantizedAabbMax._2_4_;
  *(int *)(puVar2 + 6) = tmp.m_escapeIndexOrTriangleIndex;
  return;
}

Assistant:

void	btQuantizedBvh::swapLeafNodes(int i,int splitIndex)
{
	if (m_useQuantization)
	{
			btQuantizedBvhNode tmp = m_quantizedLeafNodes[i];
			m_quantizedLeafNodes[i] = m_quantizedLeafNodes[splitIndex];
			m_quantizedLeafNodes[splitIndex] = tmp;
	} else
	{
			btOptimizedBvhNode tmp = m_leafNodes[i];
			m_leafNodes[i] = m_leafNodes[splitIndex];
			m_leafNodes[splitIndex] = tmp;
	}
}